

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_tst_rolemaskproxymodel.cpp
# Opt level: O1

void tst_RoleMaskProxyModel::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  if (_c == InvokeMetaMethod) {
    switch(_id) {
    case 0:
      autoParent((tst_RoleMaskProxyModel *)_o);
      return;
    case 1:
      initTestCase((tst_RoleMaskProxyModel *)_o);
      return;
    case 2:
      testUseRoleMask((tst_RoleMaskProxyModel *)_o);
      return;
    case 3:
      testUseRoleMask_data((tst_RoleMaskProxyModel *)_o);
      return;
    case 4:
      testInsertRow((tst_RoleMaskProxyModel *)_o);
      return;
    case 5:
      testInsertRow_data((tst_RoleMaskProxyModel *)_o);
      return;
    case 6:
      testProperties((tst_RoleMaskProxyModel *)_o);
      return;
    case 7:
      testInsertColumn((tst_RoleMaskProxyModel *)_o);
      return;
    case 8:
      testInsertColumn_data((tst_RoleMaskProxyModel *)_o);
      return;
    case 9:
      testNullModel((tst_RoleMaskProxyModel *)_o);
      return;
    case 10:
      testDataChangeSignals_data((tst_RoleMaskProxyModel *)_o);
      return;
    case 0xb:
      testDataChangeSignals((tst_RoleMaskProxyModel *)_o);
      return;
    case 0xc:
      testTransparentIfEmpty((tst_RoleMaskProxyModel *)_o);
      return;
    case 0xd:
      testTransparentIfEmpty_data((tst_RoleMaskProxyModel *)_o);
      return;
    case 0xe:
      testMergeDisplayEdit((tst_RoleMaskProxyModel *)_o);
      return;
    case 0xf:
      testMergeDisplayEdit_data((tst_RoleMaskProxyModel *)_o);
      return;
    case 0x10:
      testManageMaskedRoles((tst_RoleMaskProxyModel *)_o);
      return;
    case 0x11:
      testDisconnectedModel((tst_RoleMaskProxyModel *)_o);
      return;
    case 0x12:
      testSetItemData_data((tst_RoleMaskProxyModel *)_o);
      return;
    case 0x13:
      testSetItemData((tst_RoleMaskProxyModel *)_o);
      return;
    case 0x14:
      testSetItemDataDataChanged_data((tst_RoleMaskProxyModel *)_o);
      return;
    case 0x15:
      testSetItemDataDataChanged((tst_RoleMaskProxyModel *)_o);
      return;
    case 0x16:
      testSort((tst_RoleMaskProxyModel *)_o);
      return;
    case 0x17:
      testEmptyProxy((tst_RoleMaskProxyModel *)_o);
      return;
    case 0x18:
      testMoveRowAfter((tst_RoleMaskProxyModel *)_o);
      return;
    case 0x19:
      testMoveRowBefore((tst_RoleMaskProxyModel *)_o);
      return;
    case 0x1a:
      testMoveColumnAfter((tst_RoleMaskProxyModel *)_o);
      return;
    case 0x1b:
      testMoveColumnBefore((tst_RoleMaskProxyModel *)_o);
      return;
    case 0x1c:
      testRemoveRows_data((tst_RoleMaskProxyModel *)_o);
      return;
    case 0x1d:
      testRemoveRows((tst_RoleMaskProxyModel *)_o);
      return;
    case 0x1e:
      testRemoveColumns_data((tst_RoleMaskProxyModel *)_o);
      return;
    case 0x1f:
      testRemoveColumns((tst_RoleMaskProxyModel *)_o);
      return;
    case 0x20:
      testMaskVerticalHeaderData((tst_RoleMaskProxyModel *)_o);
      return;
    case 0x21:
      testMaskHorizontalHeaderData((tst_RoleMaskProxyModel *)_o);
      return;
    case 0x22:
      testItemDataTransParent((tst_RoleMaskProxyModel *)_o);
      return;
    case 0x23:
      testDefaultValueNonTransparent((tst_RoleMaskProxyModel *)_o);
      return;
    case 0x24:
      testMaskFlags((tst_RoleMaskProxyModel *)_o);
      return;
    case 0x25:
      testMultiData((tst_RoleMaskProxyModel *)_o);
      return;
    case 0x26:
      testClearItemData((tst_RoleMaskProxyModel *)_o);
      return;
    }
  }
  return;
}

Assistant:

void tst_RoleMaskProxyModel::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    if (_c == QMetaObject::InvokeMetaMethod) {
        auto *_t = static_cast<tst_RoleMaskProxyModel *>(_o);
        (void)_t;
        switch (_id) {
        case 0: _t->autoParent(); break;
        case 1: _t->initTestCase(); break;
        case 2: _t->testUseRoleMask(); break;
        case 3: _t->testUseRoleMask_data(); break;
        case 4: _t->testInsertRow(); break;
        case 5: _t->testInsertRow_data(); break;
        case 6: _t->testProperties(); break;
        case 7: _t->testInsertColumn(); break;
        case 8: _t->testInsertColumn_data(); break;
        case 9: _t->testNullModel(); break;
        case 10: _t->testDataChangeSignals_data(); break;
        case 11: _t->testDataChangeSignals(); break;
        case 12: _t->testTransparentIfEmpty(); break;
        case 13: _t->testTransparentIfEmpty_data(); break;
        case 14: _t->testMergeDisplayEdit(); break;
        case 15: _t->testMergeDisplayEdit_data(); break;
        case 16: _t->testManageMaskedRoles(); break;
        case 17: _t->testDisconnectedModel(); break;
        case 18: _t->testSetItemData_data(); break;
        case 19: _t->testSetItemData(); break;
        case 20: _t->testSetItemDataDataChanged_data(); break;
        case 21: _t->testSetItemDataDataChanged(); break;
        case 22: _t->testSort(); break;
        case 23: _t->testEmptyProxy(); break;
        case 24: _t->testMoveRowAfter(); break;
        case 25: _t->testMoveRowBefore(); break;
        case 26: _t->testMoveColumnAfter(); break;
        case 27: _t->testMoveColumnBefore(); break;
        case 28: _t->testRemoveRows_data(); break;
        case 29: _t->testRemoveRows(); break;
        case 30: _t->testRemoveColumns_data(); break;
        case 31: _t->testRemoveColumns(); break;
        case 32: _t->testMaskVerticalHeaderData(); break;
        case 33: _t->testMaskHorizontalHeaderData(); break;
        case 34: _t->testItemDataTransParent(); break;
        case 35: _t->testDefaultValueNonTransparent(); break;
        case 36: _t->testMaskFlags(); break;
        case 37: _t->testMultiData(); break;
        case 38: _t->testClearItemData(); break;
        default: ;
        }
    }
    (void)_a;
}